

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.c++
# Opt level: O0

double __thiscall
kj::parse::_::ParseFloat::operator()
          (ParseFloat *this,Array<char> *digits,Maybe<kj::Array<char>_> *fraction,
          Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_> *exponent)

{
  bool bVar1;
  Array<char> *pAVar2;
  size_t sVar3;
  Tuple<kj::Maybe<char>,_kj::Array<char>_> *pTVar4;
  TypeByIndex<0UL,_kj::Maybe<char>,_kj::Array<char>_> *pTVar5;
  TypeByIndex<1UL,_kj::Maybe<char>,_kj::Array<char>_> *pTVar6;
  undefined1 *size;
  char *pcVar7;
  char *pcVar8;
  double dVar9;
  ArrayPtr<char> AVar10;
  Fault local_138;
  Fault f_2;
  char *sign;
  Tuple<kj::Maybe<char>,_kj::Array<char>_> *e_1;
  Array<char> *f_1;
  char *pos;
  undefined1 local_100 [8];
  ArrayPtr<char> buf;
  Array<char> buf_heap;
  char buf_stack [128];
  bool buf_isOnStack;
  size_t buf_size;
  Tuple<kj::Maybe<char>,_kj::Array<char>_> *e;
  Array<char> *f;
  size_t bufSize;
  Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_> *exponent_local;
  Maybe<kj::Array<char>_> *fraction_local;
  Array<char> *digits_local;
  ParseFloat *this_local;
  
  f = (Array<char> *)Array<char>::size(digits);
  pAVar2 = kj::_::readMaybe<kj::Array<char>>(fraction);
  if (pAVar2 != (Array<char> *)0x0) {
    sVar3 = Array<char>::size(pAVar2);
    f = (Array<char> *)((long)&f->ptr + sVar3 + 1);
  }
  pTVar4 = kj::_::readMaybe<kj::_::Tuple<kj::Maybe<char>,kj::Array<char>>>(exponent);
  if (pTVar4 != (Tuple<kj::Maybe<char>,_kj::Array<char>_> *)0x0) {
    pTVar5 = get<0ul,kj::_::Tuple<kj::Maybe<char>,kj::Array<char>>const&>(pTVar4);
    bVar1 = Maybe<char>::operator!=(pTVar5,(void *)0x0);
    pTVar6 = get<1ul,kj::_::Tuple<kj::Maybe<char>,kj::Array<char>>const&>(pTVar4);
    sVar3 = Array<char>::size(pTVar6);
    f = (Array<char> *)((long)&f->ptr + (long)(int)(bVar1 + 1) + sVar3);
  }
  size = (undefined1 *)((long)&f->ptr + 1);
  if (size < (undefined1 *)0x81) {
    Array<char>::Array((Array<char> *)&buf.size_,(void *)0x0);
    AVar10 = arrayPtr<char>((char *)&buf_heap.disposer,(size_t)size);
  }
  else {
    heapArray<char>((Array<char> *)&buf.size_,(size_t)size);
    AVar10 = kj::Array::operator_cast_to_ArrayPtr((Array *)&buf.size_);
  }
  buf.ptr = (char *)AVar10.size_;
  local_100 = (undefined1  [8])AVar10.ptr;
  pcVar7 = ArrayPtr<char>::begin((ArrayPtr<char> *)local_100);
  pcVar8 = Array<char>::begin(digits);
  sVar3 = Array<char>::size(digits);
  memcpy(pcVar7,pcVar8,sVar3);
  sVar3 = Array<char>::size(digits);
  f_1 = (Array<char> *)(pcVar7 + sVar3);
  pAVar2 = kj::_::readMaybe<kj::Array<char>>(fraction);
  if (pAVar2 != (Array<char> *)0x0) {
    pcVar8 = (char *)((long)&f_1->ptr + 1);
    *(char *)&f_1->ptr = '.';
    pcVar7 = Array<char>::begin(pAVar2);
    sVar3 = Array<char>::size(pAVar2);
    memcpy(pcVar8,pcVar7,sVar3);
    sVar3 = Array<char>::size(pAVar2);
    f_1 = (Array<char> *)(pcVar8 + sVar3);
  }
  pTVar4 = kj::_::readMaybe<kj::_::Tuple<kj::Maybe<char>,kj::Array<char>>>(exponent);
  if (pTVar4 != (Tuple<kj::Maybe<char>,_kj::Array<char>_> *)0x0) {
    pAVar2 = (Array<char> *)((long)&f_1->ptr + 1);
    *(undefined1 *)&f_1->ptr = 0x65;
    pTVar5 = get<0ul,kj::_::Tuple<kj::Maybe<char>,kj::Array<char>>const&>(pTVar4);
    f_2.exception = (Exception *)kj::_::readMaybe<char>(pTVar5);
    if (f_2.exception != (Exception *)0x0) {
      *(char *)&pAVar2->ptr = *(char *)&((f_2.exception)->ownFile).content.ptr;
      pAVar2 = (Array<char> *)((long)&f_1->ptr + 2);
    }
    f_1 = pAVar2;
    pTVar6 = get<1ul,kj::_::Tuple<kj::Maybe<char>,kj::Array<char>>const&>(pTVar4);
    pcVar7 = Array<char>::begin(pTVar6);
    pTVar6 = get<1ul,kj::_::Tuple<kj::Maybe<char>,kj::Array<char>>const&>(pTVar4);
    sVar3 = Array<char>::size(pTVar6);
    memcpy(f_1,pcVar7,sVar3);
    pTVar6 = get<1ul,kj::_::Tuple<kj::Maybe<char>,kj::Array<char>>const&>(pTVar4);
    sVar3 = Array<char>::size(pTVar6);
    f_1 = (Array<char> *)((long)&f_1->ptr + sVar3);
  }
  *(undefined1 *)&f_1->ptr = 0;
  pcVar7 = ArrayPtr<char>::end((ArrayPtr<char> *)local_100);
  if ((char *)((long)&f_1->ptr + 1) != pcVar7) {
    kj::_::Debug::Fault::Fault
              (&local_138,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/char.c++"
               ,0x3e,FAILED,"pos == buf.end()","");
    kj::_::Debug::Fault::fatal(&local_138);
  }
  pcVar7 = ArrayPtr<char>::begin((ArrayPtr<char> *)local_100);
  dVar9 = strtod(pcVar7,(char **)0x0);
  Array<char>::~Array((Array<char> *)&buf.size_);
  return dVar9;
}

Assistant:

double ParseFloat::operator()(const Array<char>& digits,
                              const Maybe<Array<char>>& fraction,
                              const Maybe<Tuple<Maybe<char>, Array<char>>>& exponent) const {
  size_t bufSize = digits.size();
  KJ_IF_MAYBE(f, fraction) {
    bufSize += 1 + f->size();
  }
  KJ_IF_MAYBE(e, exponent) {
    bufSize += 1 + (get<0>(*e) != nullptr) + get<1>(*e).size();
  }

  KJ_STACK_ARRAY(char, buf, bufSize + 1, 128, 128);

  char* pos = buf.begin();
  memcpy(pos, digits.begin(), digits.size());
  pos += digits.size();
  KJ_IF_MAYBE(f, fraction) {
    *pos++ = '.';
    memcpy(pos, f->begin(), f->size());
    pos += f->size();
  }
  KJ_IF_MAYBE(e, exponent) {
    *pos++ = 'e';
    KJ_IF_MAYBE(sign, get<0>(*e)) {
      *pos++ = *sign;
    }
    memcpy(pos, get<1>(*e).begin(), get<1>(*e).size());
    pos += get<1>(*e).size();
  }

  *pos++ = '\0';
  KJ_DASSERT(pos == buf.end());

  return strtod(buf.begin(), nullptr);
}